

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.hpp
# Opt level: O0

uint64_t __thiscall
pstore::index::fnv_64a_hash_indirect_string::operator()
          (fnv_64a_hash_indirect_string *this,indirect_string *indir)

{
  size_type this_00;
  uint64_t uVar1;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_50;
  raw_sstring_view local_48;
  fnv_64a_hash local_31;
  undefined1 local_30 [8];
  shared_sstring_view owner;
  indirect_string *indir_local;
  fnv_64a_hash_indirect_string *this_local;
  
  owner.size_ = (size_type)indir;
  sstring_view<std::shared_ptr<const_char>_>::sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)local_30);
  this_00 = owner.size_;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::not_null
            (&local_50,(sstring_view<std::shared_ptr<const_char>_> *)local_30);
  local_48 = indirect_string::as_string_view((indirect_string *)this_00,local_50);
  uVar1 = fnv_64a_hash::operator()(&local_31,&local_48);
  sstring_view<std::shared_ptr<const_char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<const_char>_> *)local_30);
  return uVar1;
}

Assistant:

std::uint64_t operator() (indirect_string const & indir) const {
                shared_sstring_view owner;
                return fnv_64a_hash () (indir.as_string_view (&owner));
            }